

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsics.cpp
# Opt level: O3

TestCaseGroup * vkt::sparse::createSparseResourcesShaderIntrinsicsTests(TestContext *testCtx)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  SparseShaderIntrinsicsCaseBase *pSVar4;
  size_type *psVar5;
  ImageType imageType;
  TextureFormat *format;
  long lVar6;
  ImageParameters *pIVar7;
  long lVar8;
  UVec3 imageSize;
  ostringstream stream;
  string local_250;
  TestNode *local_230;
  sparse *local_228;
  TestContext *local_220;
  UVec3 local_218;
  TestNode *local_208;
  TextureFormat *local_200;
  uint local_1f4;
  TestNode *local_1f0;
  long local_1e8;
  string *local_1e0;
  long local_1d8;
  _func_int **local_1d0;
  _func_int **local_1c8;
  _func_int **local_1c0;
  _func_int **local_1b8;
  _func_int **local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1f0 = (TestNode *)operator_new(0x70);
  local_220 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f0,testCtx,"shader_intrinsics",
             "Sparse Resources Shader Intrinsics");
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::imageParametersArray == '\0') {
    createSparseResourcesShaderIntrinsicsTests();
  }
  if (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::formats == '\0') {
    createSparseResourcesShaderIntrinsicsTests();
  }
  if ((createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_ == '\0')
     && (iVar1 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)
                                      ::functions_abi_cxx11_), iVar1 != 0)) {
    createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[0].
    _M_dataplus._M_p =
         (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                   functions_abi_cxx11_[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_,
               "_sparse_fetch","");
    createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[1].
    _M_dataplus._M_p =
         (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                   functions_abi_cxx11_[1].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 1),"_sparse_read","");
    createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[2].
    _M_dataplus._M_p =
         (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                   functions_abi_cxx11_[2].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 2),"_sparse_sample_explicit_lod","");
    createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[3].
    _M_dataplus._M_p =
         (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                   functions_abi_cxx11_[3].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 3),"_sparse_sample_implicit_lod","");
    createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_[4].
    _M_dataplus._M_p =
         (pointer)&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                   functions_abi_cxx11_[4].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 4),"_sparse_gather","");
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                         functions_abi_cxx11_);
  }
  lVar8 = 0;
  local_1b8 = (_func_int **)&PTR__TestCase_00d34ae0;
  local_1c0 = (_func_int **)&PTR__TestCase_00d34bb0;
  local_1c8 = (_func_int **)&PTR__TestCase_00d34c18;
  local_1d0 = (_func_int **)&PTR__TestCase_00d34e30;
  local_1b0 = (_func_int **)&PTR__TestCase_00d34ea8;
  do {
    local_1e0 = createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
                + lVar8;
    pIVar7 = createSparseResourcesShaderIntrinsicsTests::imageParametersArray;
    lVar6 = 0;
    do {
      local_228 = (sparse *)
                  (ulong)createSparseResourcesShaderIntrinsicsTests::imageParametersArray[lVar6].
                         imageType;
      local_208 = (TestNode *)operator_new(0x70);
      getImageTypeName_abi_cxx11_(&local_250,local_228,imageType);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_250,(ulong)(local_1e0->_M_dataplus)._M_p);
      psVar5 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_1a8[0].field_2._0_8_ = *psVar5;
        local_1a8[0].field_2._8_8_ = plVar2[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar5;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_1a8[0]._M_string_length = plVar2[1];
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_208,local_220,local_1a8[0]._M_dataplus._M_p,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_1f4 = (int)local_228 - 4;
      local_1e8 = 0;
      local_1d8 = lVar6;
      do {
        local_230 = (TestNode *)operator_new(0x70);
        local_200 = createSparseResourcesShaderIntrinsicsTests::formats + local_1e8;
        getShaderImageFormatQualifier_abi_cxx11_(local_1a8,(sparse *)local_200,format);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_230,local_220,local_1a8[0]._M_dataplus._M_p,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        lVar6 = 4;
        do {
          local_218.m_data[2] = *(uint *)((long)pIVar7->imageSizes[0].m_data + lVar6 + 4);
          local_218.m_data._0_8_ = *(undefined8 *)((long)pIVar7->imageSizes[0].m_data + lVar6 + -4);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          iVar1 = (int)lVar8;
          if (iVar1 - 2U < 3) {
            if (2 < local_1f4) {
              if (iVar1 == 2) {
                pSVar4 = (SparseShaderIntrinsicsCaseBase *)operator_new(0x90);
                std::__cxx11::stringbuf::str();
                SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
                          (pSVar4,local_220,&local_250,SPARSE_SAMPLE_EXPLICIT_LOD,
                           (ImageType)local_228,&local_218,local_200);
                (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_1b8;
                tcu::TestNode::addChild(local_230,(TestNode *)pSVar4);
              }
              else if (iVar1 == 3) {
                pSVar4 = (SparseShaderIntrinsicsCaseBase *)operator_new(0x90);
                std::__cxx11::stringbuf::str();
                SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
                          (pSVar4,local_220,&local_250,SPARSE_SAMPLE_IMPLICIT_LOD,
                           (ImageType)local_228,&local_218,local_200);
                (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_1c0;
                tcu::TestNode::addChild(local_230,(TestNode *)pSVar4);
              }
              else {
                pSVar4 = (SparseShaderIntrinsicsCaseBase *)operator_new(0x90);
                std::__cxx11::stringbuf::str();
                SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
                          (pSVar4,local_220,&local_250,SPARSE_GATHER,(ImageType)local_228,&local_218
                           ,local_200);
                (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_1c8;
                tcu::TestNode::addChild(local_230,(TestNode *)pSVar4);
              }
              goto LAB_00763366;
            }
          }
          else {
            if (iVar1 == 0) {
              if (local_1f4 < 3) goto LAB_00763387;
              pSVar4 = (SparseShaderIntrinsicsCaseBase *)operator_new(0x90);
              std::__cxx11::stringbuf::str();
              SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
                        (pSVar4,local_220,&local_250,SPARSE_FETCH,(ImageType)local_228,&local_218,
                         local_200);
              (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_1d0;
              tcu::TestNode::addChild(local_230,(TestNode *)pSVar4);
            }
            else {
              pSVar4 = (SparseShaderIntrinsicsCaseBase *)operator_new(0x90);
              std::__cxx11::stringbuf::str();
              SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
                        (pSVar4,local_220,&local_250,SPARSE_READ,(ImageType)local_228,&local_218,
                         local_200);
              (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = local_1b0;
              tcu::TestNode::addChild(local_230,(TestNode *)pSVar4);
            }
LAB_00763366:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_00763387:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x34);
        tcu::TestNode::addChild(local_208,local_230);
        lVar6 = local_1d8;
        local_1e8 = local_1e8 + 1;
      } while (local_1e8 != 6);
      tcu::TestNode::addChild(local_1f0,local_208);
      lVar6 = lVar6 + 1;
      pIVar7 = pIVar7 + 1;
    } while (lVar6 != 5);
    lVar8 = lVar8 + 1;
    if (lVar8 == 5) {
      return (TestCaseGroup *)local_1f0;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSparseResourcesShaderIntrinsicsTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "shader_intrinsics", "Sparse Resources Shader Intrinsics"));

	static const deUint32 sizeCountPerImageType = 4u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_2D,		{ tcu::UVec3(512u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u), tcu::UVec3(503u, 137u, 1u), tcu::UVec3(11u, 37u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	{ tcu::UVec3(512u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } },
		{ IMAGE_TYPE_CUBE,		{ tcu::UVec3(256u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u),	tcu::UVec3(137u, 137u, 1u),	tcu::UVec3(11u, 11u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY,{ tcu::UVec3(256u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(137u, 137u, 3u),	tcu::UVec3(11u, 11u, 3u) } },
		{ IMAGE_TYPE_3D,		{ tcu::UVec3(256u, 256u, 16u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8)
	};

	static const std::string functions[SPARSE_SPIRV_FUNCTION_TYPE_LAST] =
	{
		"_sparse_fetch",
		"_sparse_read",
		"_sparse_sample_explicit_lod",
		"_sparse_sample_implicit_lod",
		"_sparse_gather",
	};

	for (deUint32 functionNdx = 0; functionNdx < SPARSE_SPIRV_FUNCTION_TYPE_LAST; ++functionNdx)
	{
		const SpirVFunction function = static_cast<SpirVFunction>(functionNdx);

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
		{
			const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
			de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, (getImageTypeName(imageType) + functions[functionNdx]).c_str(), ""));

			for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
			{
				const tcu::TextureFormat&		format = formats[formatNdx];
				de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

				for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
				{
					const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

					std::ostringstream stream;
					stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

					switch (function)
					{
					case SPARSE_FETCH:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY)) continue;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
					case SPARSE_SAMPLE_IMPLICIT_LOD:
					case SPARSE_GATHER:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY) || (imageType == IMAGE_TYPE_3D)) continue;
						break;
					default:
						break;
					}

					switch (function)
					{
					case SPARSE_FETCH:
						formatGroup->addChild(new SparseCaseOpImageSparseFetch(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_READ:
						formatGroup->addChild(new SparseCaseOpImageSparseRead(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleExplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_IMPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleImplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_GATHER:
						formatGroup->addChild(new SparseCaseOpImageSparseGather(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					default:
						DE_ASSERT(0);
						break;
					}
				}
				imageTypeGroup->addChild(formatGroup.release());
			}
			testGroup->addChild(imageTypeGroup.release());
		}
	}

	return testGroup.release();
}